

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb.c
# Opt level: O0

void av1_xform_quant(MACROBLOCK *x,int plane,int block,int blk_row,int blk_col,
                    BLOCK_SIZE plane_bsize,TxfmParam *txfm_param,QUANT_PARAM *qparam)

{
  undefined8 in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  int in_stack_00000008;
  undefined3 in_stack_0000000c;
  QUANT_PARAM *in_stack_00000028;
  MACROBLOCK *in_stack_00000040;
  
  av1_xform((MACROBLOCK *)CONCAT44(blk_row,blk_col),_in_stack_0000000c,in_stack_00000008,
            unaff_retaddr_00,unaff_retaddr,(BLOCK_SIZE)((ulong)in_RDI >> 0x38),(TxfmParam *)x);
  av1_quant(in_stack_00000040,qparam._4_4_,(int)qparam,txfm_param,in_stack_00000028);
  return;
}

Assistant:

void av1_xform_quant(MACROBLOCK *x, int plane, int block, int blk_row,
                     int blk_col, BLOCK_SIZE plane_bsize, TxfmParam *txfm_param,
                     const QUANT_PARAM *qparam) {
  av1_xform(x, plane, block, blk_row, blk_col, plane_bsize, txfm_param);
  av1_quant(x, plane, block, txfm_param, qparam);
}